

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

void __thiscall cmServer::~cmServer(cmServer *this)

{
  pointer ppcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppcVar2;
  
  (this->super_cmServerBase)._vptr_cmServerBase = (_func_int **)&PTR__cmServer_007918c8;
  cmServerBase::Close(&this->super_cmServerBase);
  ppcVar1 = (this->SupportedProtocols).
            super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar2 = (this->SupportedProtocols).
                 super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1) {
    if (*ppcVar2 != (cmServerProtocol *)0x0) {
      (*(*ppcVar2)->_vptr_cmServerProtocol[1])();
    }
  }
  ppcVar2 = (this->SupportedProtocols).
            super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->SupportedProtocols).
                                  super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
  }
  this_00 = (this->fileMonitor).super___shared_ptr<cmFileMonitor,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  cmServerBase::~cmServerBase(&this->super_cmServerBase);
  return;
}

Assistant:

cmServer::~cmServer()
{
  Close();

  for (cmServerProtocol* p : this->SupportedProtocols) {
    delete p;
  }
}